

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float16_to_float32_riscv32(float16 a,_Bool ieee,float_status *s)

{
  FloatFmt *parm;
  undefined7 in_register_00000031;
  FloatParts FVar1;
  
  parm = &float16_params_ahp;
  if ((int)CONCAT71(in_register_00000031,ieee) != 0) {
    parm = &float16_params;
  }
  FVar1._8_8_ = (ulong)(a >> 10 & 0x1f) | (ulong)(a & 0x8000) << 0x19;
  FVar1.frac = (ulong)(a & 0x3ff);
  FVar1 = sf_canonicalize(FVar1,parm,s);
  FVar1 = float_to_float(FVar1,&float32_params,s);
  FVar1 = round_canonical(FVar1,s,&float32_params);
  return (uint)FVar1.frac & 0x7fffff | (FVar1.exp & 0xffU) << 0x17 |
         (uint)(FVar1._8_8_ >> 9) & 0x80000000;
}

Assistant:

float32 float16_to_float32(float16 a, bool ieee, float_status *s)
{
    const FloatFmt *fmt16 = ieee ? &float16_params : &float16_params_ahp;
    FloatParts p = float16a_unpack_canonical(a, s, fmt16);
    FloatParts pr = float_to_float(p, &float32_params, s);
    return float32_round_pack_canonical(pr, s);
}